

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var __thiscall
Js::TypedArrayBase::FindMinOrMax
          (TypedArrayBase *this,ScriptContext *scriptContext,TypeId typeId,bool findMax)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
    JavascriptError::ThrowTypeError
              ((((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  switch(typeId) {
  case TypeIds_Int8Array:
    pvVar3 = FindMinOrMax<char,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Uint8Array:
  case TypeIds_Uint8ClampedArray:
    pvVar3 = FindMinOrMax<unsigned_char,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Int16Array:
    pvVar3 = FindMinOrMax<short,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Uint16Array:
    pvVar3 = FindMinOrMax<unsigned_short,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Int32Array:
    pvVar3 = FindMinOrMax<int,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Uint32Array:
    pvVar3 = FindMinOrMax<unsigned_int,false>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Float32Array:
    pvVar3 = FindMinOrMax<float,true>(this,scriptContext,findMax);
    return pvVar3;
  case TypeIds_Float64Array:
    pvVar3 = FindMinOrMax<double,true>(this,scriptContext,findMax);
    return pvVar3;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                              ,0x9dd,"(false)","Unsupported array for fast path");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
  return (Var)0x0;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, TypeId typeId, bool findMax)
    {
        if (this->IsDetachedBuffer()) // 9.4.5.8 IntegerIndexedElementGet
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
        }

        switch (typeId)
        {
        case TypeIds_Int8Array:
            return this->FindMinOrMax<int8, false>(scriptContext, findMax);

        case TypeIds_Uint8Array:
        case TypeIds_Uint8ClampedArray:
            return this->FindMinOrMax<uint8, false>(scriptContext, findMax);

        case TypeIds_Int16Array:
            return this->FindMinOrMax<int16, false>(scriptContext, findMax);

        case TypeIds_Uint16Array:
            return this->FindMinOrMax<uint16, false>(scriptContext, findMax);

        case TypeIds_Int32Array:
            return this->FindMinOrMax<int32, false>(scriptContext, findMax);

        case TypeIds_Uint32Array:
            return this->FindMinOrMax<uint32, false>(scriptContext, findMax);

        case TypeIds_Float32Array:
            return this->FindMinOrMax<float, true>(scriptContext, findMax);

        case TypeIds_Float64Array:
            return this->FindMinOrMax<double, true>(scriptContext, findMax);

        default:
            AssertMsg(false, "Unsupported array for fast path");
            return nullptr;
        }
    }